

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void text_data_bss_gaps(LinkedSection **sections)

{
  LinkedSection *pLVar1;
  LinkedSection *pLVar2;
  LinkedSection *pLVar3;
  
  pLVar1 = *sections;
  pLVar2 = sections[1];
  if (pLVar1 != (LinkedSection *)0x0) {
    pLVar3 = pLVar2;
    if ((pLVar2 == (LinkedSection *)0x0) && (pLVar3 = sections[2], pLVar3 == (LinkedSection *)0x0))
    {
      return;
    }
    if (pLVar3->base != 0) {
      pLVar1->gapsize = pLVar3->base - (pLVar1->base + pLVar1->size);
    }
  }
  if ((pLVar2 != (LinkedSection *)0x0) && (sections[2] != (LinkedSection *)0x0)) {
    pLVar2->gapsize = sections[2]->base - (pLVar2->base + pLVar2->filesize);
  }
  return;
}

Assistant:

void text_data_bss_gaps(struct LinkedSection **sections)
/* calculate gap size between text-data and data-bss */
{
  if (sections[0]) {
    unsigned long nextsecbase = sections[1] ? sections[1]->base :
                                (sections[2] ? sections[2]->base : 0);
    if (nextsecbase) {
      sections[0]->gapsize = nextsecbase -
                             (sections[0]->base + sections[0]->size);
    }
  }
  if (sections[1] && sections[2]) {
    sections[1]->gapsize = sections[2]->base -
                           (sections[1]->base + sections[1]->filesize);
  }
}